

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O2

int Cnf_DataWriteAndClauses(void *p,Cnf_Dat_t *pCnf)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  undefined8 in_RAX;
  void *pvVar2;
  int i;
  undefined4 uStack_38;
  int Lit;
  
  i = 0;
  _uStack_38 = in_RAX;
  do {
    p_00 = pCnf->pMan->vCos;
    if (p_00->nSize <= i) {
      return 1;
    }
    pvVar2 = Vec_PtrEntry(p_00,i);
    _uStack_38 = CONCAT44(pCnf->pVarNums[*(int *)((long)pvVar2 + 0x24)] * 2,uStack_38);
    iVar1 = sat_solver_addclause((sat_solver *)p,&Lit,(lit *)&stack0xffffffffffffffd0);
    i = i + 1;
  } while (iVar1 != 0);
  return 0;
}

Assistant:

int Cnf_DataWriteAndClauses( void * p, Cnf_Dat_t * pCnf )
{
    sat_solver * pSat = (sat_solver *)p;
    Aig_Obj_t * pObj;
    int i, Lit;
    Aig_ManForEachCo( pCnf->pMan, pObj, i )
    {
        Lit = toLitCond( pCnf->pVarNums[pObj->Id], 0 );
        if ( !sat_solver_addclause( pSat, &Lit, &Lit+1 ) )
            return 0;
    }
    return 1;
}